

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O3

void __thiscall
swrenderer::FCoverageBuffer::InsertSpan(FCoverageBuffer *this,int listnum,int start,int stop)

{
  short *psVar1;
  Span *pSVar2;
  Span *pSVar3;
  int iVar4;
  
  if (this->NumLists <= (uint)listnum) {
    __assert_fail("unsigned(listnum) < NumLists",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_things.cpp"
                  ,0xc1f,"void swrenderer::FCoverageBuffer::InsertSpan(int, int, int)");
  }
  if (stop <= start) {
    __assert_fail("start < stop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_things.cpp"
                  ,0xc20,"void swrenderer::FCoverageBuffer::InsertSpan(int, int, int)");
  }
  pSVar3 = (Span *)(this->Spans + listnum);
  if ((pSVar3->NextSpan == (Span *)0x0) || (pSVar2 = pSVar3, stop < pSVar3->NextSpan->Start)) {
LAB_002f1cab:
    pSVar2 = this->FreeSpans;
    if (pSVar2 == (Span *)0x0) {
      pSVar2 = (Span *)FMemArena::Alloc(&this->SpanArena,0x10);
    }
    else {
      this->FreeSpans = pSVar2->NextSpan;
    }
    pSVar2->NextSpan = pSVar3->NextSpan;
    pSVar2->Start = (short)start;
    pSVar2->Stop = (short)stop;
    pSVar3->NextSpan = pSVar2;
  }
  else {
    do {
      pSVar3 = pSVar2;
      pSVar2 = pSVar3->NextSpan;
      if (pSVar2 == (Span *)0x0) goto LAB_002f1cab;
      iVar4 = (int)pSVar2->Stop;
    } while (iVar4 < start);
    if (start < pSVar2->Start) {
      if (stop < pSVar2->Start) goto LAB_002f1cab;
      pSVar2->Start = (short)start;
      if (stop <= iVar4) goto LAB_002f1d0a;
    }
    else if (stop <= iVar4) {
      return;
    }
    pSVar2->Stop = (short)stop;
    while( true ) {
      pSVar3 = pSVar2->NextSpan;
      if ((pSVar3 == (Span *)0x0) || (stop < pSVar3->Start)) goto LAB_002f1d0a;
      if (stop < pSVar3->Stop) break;
      pSVar2->NextSpan = pSVar3->NextSpan;
      pSVar3->NextSpan = this->FreeSpans;
      this->FreeSpans = pSVar3;
    }
    pSVar2->Stop = pSVar3->Stop;
    pSVar2->NextSpan = pSVar3->NextSpan;
    pSVar3->NextSpan = this->FreeSpans;
    this->FreeSpans = pSVar3;
  }
LAB_002f1d0a:
  pSVar3 = this->Spans[listnum];
  if (pSVar3 != (Span *)0x0) {
    while( true ) {
      psVar1 = &pSVar3->Stop;
      if (*psVar1 <= pSVar3->Start) {
        __assert_fail("span->Start < span->Stop",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_things.cpp"
                      ,0xc6f,"void swrenderer::FCoverageBuffer::InsertSpan(int, int, int)");
      }
      pSVar3 = pSVar3->NextSpan;
      if (pSVar3 == (Span *)0x0) break;
      if (pSVar3->Start <= *psVar1) {
        __assert_fail("span->Stop < span->NextSpan->Start",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/r_things.cpp"
                      ,0xc72,"void swrenderer::FCoverageBuffer::InsertSpan(int, int, int)");
      }
    }
  }
  return;
}

Assistant:

void FCoverageBuffer::InsertSpan(int listnum, int start, int stop)
{
	assert(unsigned(listnum) < NumLists);
	assert(start < stop);

	Span **span_p = &Spans[listnum];
	Span *span;

	if (*span_p == NULL || (*span_p)->Start > stop)
	{ // This list is empty or the first entry is after this one, so we can just insert the span.
		goto addspan;
	}

	// Insert the new span in order, merging with existing ones.
	while (*span_p != NULL)
	{
		if ((*span_p)->Stop < start)							// =====		(existing span)
		{ // Span ends before this one starts.					//		  ++++	(new span)
			span_p = &(*span_p)->NextSpan;
			continue;
		}

		// Does the new span overlap or abut the existing one?
		if ((*span_p)->Start <= start)
		{
			if ((*span_p)->Stop >= stop)						// =============
			{ // The existing span completely covers this one.	//     +++++
				return;
			}
extend:		// Extend the existing span with the new one.		// ======
			span = *span_p;										//     +++++++
			span->Stop = stop;									// (or)  +++++

			// Free up any spans we just covered up.
			span_p = &(*span_p)->NextSpan;
			while (*span_p != NULL && (*span_p)->Start <= stop && (*span_p)->Stop <= stop)
			{
				Span *span = *span_p;							// ======  ======
				*span_p = span->NextSpan;						//     +++++++++++++
				span->NextSpan = FreeSpans;
				FreeSpans = span;
			}
			if (*span_p != NULL && (*span_p)->Start <= stop)	// =======         ========
			{ // Our new span connects two existing spans.		//     ++++++++++++++
			  // They should all be collapsed into a single span.
				span->Stop = (*span_p)->Stop;
				span = *span_p;
				*span_p = span->NextSpan;
				span->NextSpan = FreeSpans;
				FreeSpans = span;
			}
			goto check;
		}
		else if ((*span_p)->Start <= stop)						//        =====
		{ // The new span extends the existing span from		//    ++++
		  // the beginning.										// (or) ++++
			(*span_p)->Start = start;
			if ((*span_p)->Stop < stop)
			{ // The new span also extends the existing span	//     ======
			  // at the bottom									// ++++++++++++++
				goto extend;
			}
			goto check;
		}
		else													//         ======
		{ // No overlap, so insert a new span.					// +++++
			goto addspan;
		}
	}
	// Append a new span to the end of the list.
addspan:
	span = AllocSpan();
	span->NextSpan = *span_p;
	span->Start = start;
	span->Stop = stop;
	*span_p = span;
check:
#ifdef _DEBUG
	// Validate the span list: Spans must be in order, and there must be
	// at least one pixel between spans.
	for (span = Spans[listnum]; span != NULL; span = span->NextSpan)
	{
		assert(span->Start < span->Stop);
		if (span->NextSpan != NULL)
		{
			assert(span->Stop < span->NextSpan->Start);
		}
	}
#endif
	;
}